

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

i64 sqlite3VdbeIntValue(Mem *pMem)

{
  ushort uVar1;
  i64 iVar2;
  i64 value;
  i64 local_10;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 4) != 0) {
    return (pMem->u).i;
  }
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x12) != 0) {
      local_10 = 0;
      sqlite3Atoi64(pMem->z,&local_10,pMem->n,pMem->enc);
      return local_10;
    }
    return 0;
  }
  iVar2 = -0x8000000000000000;
  if (ABS(pMem->r) <= 9.223372036854776e+18) {
    iVar2 = (long)pMem->r;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE i64 sqlite3VdbeIntValue(Mem *pMem){
  int flags;
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  flags = pMem->flags;
  if( flags & MEM_Int ){
    return pMem->u.i;
  }else if( flags & MEM_Real ){
    return doubleToInt64(pMem->r);
  }else if( flags & (MEM_Str|MEM_Blob) ){
    i64 value = 0;
    assert( pMem->z || pMem->n==0 );
    testcase( pMem->z==0 );
    sqlite3Atoi64(pMem->z, &value, pMem->n, pMem->enc);
    return value;
  }else{
    return 0;
  }
}